

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexUtils.cpp
# Opt level: O2

void Ptex::v2_2::PtexUtils::anon_unknown_1::average<unsigned_char>
               (uchar *src,int sstride,int uw,int vw,uchar *dst,int nchan)

{
  uchar *puVar1;
  long lVar2;
  int i_1;
  uchar *puVar3;
  ulong uVar4;
  void *__s;
  ulong uVar5;
  undefined8 uStack_40;
  float local_38;
  int local_34;
  
  lVar2 = -((long)nchan * 4 + 0xfU & 0xfffffffffffffff0);
  __s = (void *)((long)&local_38 + lVar2);
  local_38 = (float)vw;
  local_34 = uw;
  *(undefined8 *)((long)&uStack_40 + lVar2) = 0x1261dc;
  memset(__s,0,(long)nchan * 4);
  puVar3 = src + (int)local_38 * sstride;
  uVar5 = (ulong)(uint)nchan;
  if (nchan < 1) {
    uVar5 = 0;
  }
  while (src != puVar3) {
    puVar1 = src + nchan * local_34;
    for (; src != puVar1; src = src + uVar4) {
      for (uVar4 = 0; uVar5 != uVar4; uVar4 = uVar4 + 1) {
        *(float *)((long)__s + uVar4 * 4) = (float)src[uVar4] + *(float *)((long)__s + uVar4 * 4);
      }
    }
    src = puVar1 + (sstride - nchan * local_34);
  }
  for (uVar4 = 0; uVar5 != uVar4; uVar4 = uVar4 + 1) {
    dst[uVar4] = (uchar)(int)(*(float *)((long)__s + uVar4 * 4) *
                             (1.0 / (float)((int)local_38 * local_34)));
  }
  return;
}

Assistant:

inline void average(const T* src, int sstride, int uw, int vw,
                        T* dst, int nchan)
    {
        float* buff = (float*) alloca(nchan*sizeof(float));
        memset(buff, 0, nchan*sizeof(float));
        sstride /= (int)sizeof(T);
        int rowlen = uw*nchan;
        int rowskip = sstride - rowlen;
        for (const T* end = src + vw*sstride; src != end; src += rowskip)
            for (const T* rowend = src + rowlen; src != rowend;)
                for (int i = 0; i < nchan; i++) buff[i] += (float)*src++;
        float scale = 1.0f/(float)(uw*vw);
        for (int i = 0; i < nchan; i++) dst[i] = T(buff[i]*scale);
    }